

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encryptdict.c
# Opt level: O0

HPDF_EncryptDict HPDF_EncryptDict_New(HPDF_MMgr mmgr,HPDF_Xref xref)

{
  HPDF_Encrypt attr_00;
  HPDF_STATUS HVar1;
  HPDF_EncryptDict dict;
  HPDF_Encrypt attr;
  HPDF_Xref xref_local;
  HPDF_MMgr mmgr_local;
  
  mmgr_local = (HPDF_MMgr)HPDF_Dict_New(mmgr);
  if ((HPDF_Dict)mmgr_local == (HPDF_Dict)0x0) {
    mmgr_local = (HPDF_MMgr)0x0;
  }
  else {
    (((HPDF_Dict)mmgr_local)->header).obj_class =
         (((HPDF_Dict)mmgr_local)->header).obj_class | 0x900;
    ((HPDF_Dict)mmgr_local)->free_fn = HPDF_EncryptDict_OnFree;
    attr_00 = (HPDF_Encrypt)HPDF_GetMem(((HPDF_Dict)mmgr_local)->mmgr,0x1c4);
    if (attr_00 == (HPDF_Encrypt)0x0) {
      HPDF_Dict_Free((HPDF_Dict)mmgr_local);
      mmgr_local = (HPDF_MMgr)0x0;
    }
    else {
      ((HPDF_Dict)mmgr_local)->attr = attr_00;
      HPDF_Encrypt_Init(attr_00);
      HVar1 = HPDF_Xref_Add(xref,mmgr_local);
      if (HVar1 != 0) {
        mmgr_local = (HPDF_MMgr)0x0;
      }
    }
  }
  return (HPDF_EncryptDict)mmgr_local;
}

Assistant:

HPDF_EncryptDict
HPDF_EncryptDict_New  (HPDF_MMgr  mmgr,
                       HPDF_Xref  xref)
{
    HPDF_Encrypt attr;
    HPDF_EncryptDict dict;

    HPDF_PTRACE((" HPDF_EncryptDict_New\n"));

    dict = HPDF_Dict_New (mmgr);
    if (!dict)
        return NULL;

    dict->header.obj_class |= HPDF_OSUBCLASS_ENCRYPT;
    dict->free_fn = HPDF_EncryptDict_OnFree;

    attr = HPDF_GetMem (dict->mmgr, sizeof(HPDF_Encrypt_Rec));
    if (!attr) {
        HPDF_Dict_Free (dict);
        return NULL;
    }

    dict->attr = attr;
    HPDF_Encrypt_Init (attr);

    if (HPDF_Xref_Add (xref, dict) != HPDF_OK)
        return NULL;

    return dict;
}